

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
::push_back(vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
            *this,BilinearPatchMesh **value)

{
  size_t sVar1;
  size_t n;
  
  sVar1 = this->nAlloc;
  if (sVar1 == this->nStored) {
    n = 4;
    if (sVar1 != 0) {
      n = sVar1 * 2;
    }
    reserve(this,n);
  }
  sVar1 = this->nStored;
  this->ptr[sVar1] = *value;
  this->nStored = sVar1 + 1;
  return;
}

Assistant:

void push_back(const T &value) {
        if (nAlloc == nStored)
            reserve(nAlloc == 0 ? 4 : 2 * nAlloc);

        alloc.construct(ptr + nStored, value);
        ++nStored;
    }